

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O0

void __thiscall IPAsKeyLRU::IPAsKeyLRU(IPAsKeyLRU *this,uint8_t *addr,size_t addr_len)

{
  size_t addr_len_local;
  uint8_t *addr_local;
  IPAsKeyLRU *this_local;
  
  IPAsKey::IPAsKey(&this->super_IPAsKey,addr,addr_len);
  (this->super_IPAsKey)._vptr_IPAsKey = (_func_int **)&PTR__IPAsKeyLRU_0025a480;
  this->MoreRecentKey = (IPAsKeyLRU *)0x0;
  this->LessRecentKey = (IPAsKeyLRU *)0x0;
  return;
}

Assistant:

IPAsKeyLRU::IPAsKeyLRU(uint8_t * addr, size_t addr_len)
    :
    IPAsKey(addr, addr_len),
    MoreRecentKey(NULL),
    LessRecentKey(NULL)
{
}